

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

void __thiscall QtMWidgets::StepperPrivate::makeClick(StepperPrivate *this)

{
  int step;
  
  if (this->button == Plus) {
    step = 1;
    if (this->plusButtonEnabled != true) {
      return;
    }
  }
  else if ((this->button != Minus) || (step = -1, this->minusButtonEnabled == false)) {
    return;
  }
  Stepper::stepBy(this->q,step);
  return;
}

Assistant:

void
StepperPrivate::makeClick()
{
	switch( button )
	{
		case StepperPrivate::Minus :
		{
			if( minusButtonEnabled )
				q->stepBy( -1 );
		}
			break;

		case StepperPrivate::Plus :
		{
			if( plusButtonEnabled )
				q->stepBy( 1 );
		}
			break;

		default:
			break;
	}
}